

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadable.h
# Opt level: O2

void __thiscall chrono::ChNodeXYZ::ChNodeXYZ(ChNodeXYZ *this,void **vtt)

{
  ChLoadableUVW CVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  
  CVar1 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)(this->pos).m_data + *(long *)((long)CVar1 + -0x78) + -8) = vtt[2];
  CVar1 = (ChLoadableUVW)*vtt;
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)(this->pos).m_data + *(long *)((long)CVar1 + -0x80) + -8) = vtt[3];
  *(void **)((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0x78) + -8) =
       vtt[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = VNULL;
  (this->pos).m_data[0] = VNULL;
  dVar2 = DAT_011dd3e0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = DAT_011dd3e0;
  (this->pos).m_data[1] = DAT_011dd3e0;
  dVar3 = DAT_011dd3e8;
  auVar4 = vmovlhps_avx(auVar4,auVar6);
  auVar5._16_8_ = DAT_011dd3e8;
  auVar5._0_16_ = auVar4;
  auVar5._24_8_ = 0;
  (this->pos).m_data[2] = DAT_011dd3e8;
  auVar5 = vpermpd_avx2(auVar5,0x24);
  this->pos_dt = (ChVector<double>)auVar5._0_24_;
  (this->pos_dtdt).m_data[0] = (double)auVar5._24_8_;
  (this->pos_dtdt).m_data[1] = dVar2;
  (this->pos_dtdt).m_data[2] = dVar3;
  return;
}

Assistant:

virtual public ChLoadable {
  public:
    virtual ~ChLoadableUVW() {}

    /// Evaluate N'*F , where N is some type of shape function
    /// evaluated at U,V,W coordinates of the volume, each ranging in [-1..+1], except if IsTetrahedronIntegrationNeeded() true or IsTrianglePrismIntegrationNeeded() true.
    /// F is a load, N'*F is the resulting generalized load
    /// Returns also det[J] with J=[dx/du,..], that might be useful in gauss quadrature.
    virtual void ComputeNF(const double U,              ///< parametric coordinate in volume
                           const double V,              ///< parametric coordinate in volume
                           const double W,              ///< parametric coordinate in volume
                           ChVectorDynamic<>& Qi,       ///< Return result of N'*F  here, maybe with offset block_offset
                           double& detJ,                ///< Return det[J] here
                           const ChVectorDynamic<>& F,  ///< Input F vector, size is = n.field coords.
                           ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                           ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                           ) = 0;

    /// This can be useful for loadable objects that has some density property, so it can be
    /// accessed by ChLoaderVolumeGravity. Return 0 if the element/nodes does not support xyz gravity.
    virtual double GetDensity() = 0;

    /// If true, use quadrature over u,v,w in [0..1] range as tetrahedron volumetric coords (with z=1-u-v-w)
    /// otherwise use default quadrature over u,v,w in [-1..+1] as box isoparametric coords.
    virtual bool IsTetrahedronIntegrationNeeded() { return false; }

	/// If true, use quadrature over u,v  in [0..1] range as triangle natural coords (with z=1-u-v), and use linear quadrature over w in [-1..+1],
    /// otherwise use default quadrature over u,v,w in [-1..+1] as box isoparametric coords.
    virtual bool IsTrianglePrismIntegrationNeeded() { return false; }

}